

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

void MlmWrap::message_reactor_task(zsock_t *pipe,void *args)

{
  zloop_t *self;
  zsock_t *sock;
  undefined8 uVar1;
  zloop_t *loop;
  
  zsock_signal(pipe,'\0');
  self = zloop_new();
  loop = self;
  sock = (zsock_t *)mlm_client_msgpipe(*(undefined8 *)((long)args + 0x30));
  zloop_reader(self,sock,handle_mlm_msgpipe,args);
  zloop_reader(self,pipe,handle_usr_msgpipe,args);
  zloop_timer(self,0x19,0,handle_abs_timer,args);
  *(zloop_t **)((long)args + 0x38) = self;
  *(zsock_t **)((long)args + 0x48) = pipe;
  uVar1 = mlm_client_msgpipe(*(undefined8 *)((long)args + 0x30));
  *(undefined8 *)((long)args + 0x50) = uVar1;
  zloop_start(self);
  zloop_reader_end(self,*(zsock_t **)((long)args + 0x48));
  zloop_reader_end(self,*(zsock_t **)((long)args + 0x50));
  if (*(zsock_t **)((long)args + 0x58) != (zsock_t *)0x0) {
    zloop_reader_end(self,*(zsock_t **)((long)args + 0x58));
  }
  zloop_destroy(&loop);
  if (*(zsock_t **)((long)args + 0x58) != (zsock_t *)0x0) {
    zsock_destroy_checked
              ((zsock_t **)((long)args + 0x58),
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/networkincludes.cpp"
               ,0x51f);
  }
  mlm_client_destroy((long)args + 0x30);
  removeAllSubs((MlmWrap *)args);
  zsock_signal(pipe,'\0');
  return;
}

Assistant:

void MlmWrap::message_reactor_task(zsock_t *pipe, void *args){
    MlmWrap *self = (MlmWrap*)args;
    zsock_signal(pipe, 0);

    //Create loop
    zloop_t *loop = zloop_new();

    //Set reader for pipe for incoming messages
    zloop_reader(loop, mlm_client_msgpipe(self->client), MlmWrap::handle_mlm_msgpipe, self);
    //Set reader for pipe for outgoing messages
    zloop_reader(loop, pipe, MlmWrap::handle_usr_msgpipe, self);
    //Set timer that runs for Abstractmoduleclient to utilize
    zloop_timer(loop, 25, 0, MlmWrap::handle_abs_timer, self);
    //Set variables
    self->reactor = loop;
    self->usrpipe = pipe;
    self->mlmpipe = mlm_client_msgpipe(self->client);

    //Start loop
    zloop_start(loop);

    //End and deallocate
    zloop_reader_end(loop, self->usrpipe);
    zloop_reader_end(loop, self->mlmpipe);
    if(self->hardwaresock) zloop_reader_end(loop, self->hardwaresock);
    zloop_destroy(&loop);
    if(self->hardwaresock) zsock_destroy(&self->hardwaresock);
    mlm_client_destroy(&self->client);
    self->removeAllSubs();
    zsock_signal(pipe, 0);
}